

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Pseudo>::copyAppend
          (QGenericArrayOps<QCss::Pseudo> *this,Pseudo *b,Pseudo *e)

{
  Pseudo *pPVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pPVar1 = (this->super_QArrayDataPointer<QCss::Pseudo>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QCss::Pseudo>).size;
    do {
      pPVar1[lVar3].type = b->type;
      pDVar2 = (b->name).d.d;
      pPVar1[lVar3].name.d.d = pDVar2;
      pPVar1[lVar3].name.d.ptr = (b->name).d.ptr;
      pPVar1[lVar3].name.d.size = (b->name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->function).d.d;
      pPVar1[lVar3].function.d.d = pDVar2;
      pPVar1[lVar3].function.d.ptr = (b->function).d.ptr;
      pPVar1[lVar3].function.d.size = (b->function).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pPVar1[lVar3].negated = b->negated;
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<QCss::Pseudo>).size + 1;
      (this->super_QArrayDataPointer<QCss::Pseudo>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }